

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmBitFieldDn<(moira::Instr)136,(moira::Mode)2,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  u32 uVar1;
  int iVar2;
  Syntax SVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  char cVar9;
  uint uVar10;
  Dn dn;
  byte bVar11;
  uint uVar12;
  Ea<(moira::Mode)2,_4> result;
  u32 local_44;
  ushort local_40;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar4 = (*this->_vptr_Moira[6])();
  if (((short)uVar4 < 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)136,(moira::Mode)2,4>(this,str,addr,op);
    return;
  }
  uVar5 = uVar4 & 0xffff;
  local_40 = op & 7;
  uVar12 = uVar5 >> 6;
  uVar10 = uVar12 & 0x1f;
  s = &str->ptr;
  cVar9 = 'b';
  lVar7 = 1;
  do {
    pcVar8 = *s;
    *s = pcVar8 + 1;
    *pcVar8 = cVar9;
    cVar9 = "bfexts"[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 7);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar8 = *s;
    *s = pcVar8 + 1;
    *pcVar8 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    do {
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = ' ';
    } while (str->ptr < str->base + iVar2);
  }
  local_44 = *addr;
  StrWriter::operator<<(str,(Ea<(moira::Mode)2,_4> *)&local_44);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    uVar6 = uVar4 & 0x820;
    pcVar8 = *s;
    *s = pcVar8 + 1;
    *pcVar8 = ',';
    if (uVar6 < 0x800) {
      if (uVar6 != 0) {
        sprintd_signed(s,(ulong)uVar10);
LAB_003c7de2:
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = ',';
        StrWriter::operator<<(str,(Dn)(uVar4 & 7));
        goto LAB_003c7e62;
      }
      sprintd_signed(s,(ulong)uVar10);
      pcVar8 = *s;
      *s = pcVar8 + 1;
    }
    else {
      if (uVar6 != 0x800) {
        StrWriter::operator<<(str,(Dn)(uVar12 & 7));
        goto LAB_003c7de2;
      }
      StrWriter::operator<<(str,(Dn)(uVar12 & 7));
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
    }
    *pcVar8 = ',';
    sprintd_signed(s,(ulong)(uVar4 & 0x1f));
    goto LAB_003c7e62;
  }
  bVar11 = 0x20;
  if ((uVar4 & 0x1f) != 0) {
    bVar11 = (byte)uVar5 & 0x1f;
  }
  uVar4 = uVar4 & 0x820;
  if (uVar4 < 0x800) {
    if (uVar4 != 0) {
      cVar9 = ' ';
      lVar7 = 0;
      do {
        pcVar8 = *s;
        *s = pcVar8 + 1;
        *pcVar8 = cVar9;
        cVar9 = " {"[lVar7 + 1];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 2);
      sprintd_signed(s,(ulong)uVar10);
LAB_003c7e34:
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = ':';
      dn.raw._1_3_ = 0;
      dn.raw._0_1_ = bVar11 & 7;
      StrWriter::operator<<(str,dn);
      goto LAB_003c7e53;
    }
    cVar9 = ' ';
    lVar7 = 0;
    do {
      pcVar8 = *s;
      *s = pcVar8 + 1;
      *pcVar8 = cVar9;
      cVar9 = " {"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
    sprintd_signed(s,(ulong)uVar10);
    pcVar8 = *s;
    *s = pcVar8 + 1;
    *pcVar8 = ':';
    sprintd_signed(s,(ulong)bVar11);
    pcVar8 = *s;
    *s = pcVar8 + 1;
  }
  else {
    if (uVar4 != 0x800) {
      cVar9 = ' ';
      lVar7 = 0;
      do {
        pcVar8 = *s;
        *s = pcVar8 + 1;
        *pcVar8 = cVar9;
        cVar9 = " {"[lVar7 + 1];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 2);
      StrWriter::operator<<(str,(Dn)(uVar12 & 7));
      goto LAB_003c7e34;
    }
    cVar9 = ' ';
    lVar7 = 0;
    do {
      pcVar8 = *s;
      *s = pcVar8 + 1;
      *pcVar8 = cVar9;
      cVar9 = " {"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
    StrWriter::operator<<(str,(Dn)(uVar12 & 7));
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
    *pcVar8 = ':';
    sprintd_signed(s,(ulong)bVar11);
LAB_003c7e53:
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
  }
  *pcVar8 = '}';
LAB_003c7e62:
  pcVar8 = str->ptr;
  str->ptr = pcVar8 + 1;
  *pcVar8 = ',';
  SVar3 = str->style->syntax;
  if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
    pcVar8 = *s;
    *s = pcVar8 + 1;
    *pcVar8 = ' ';
  }
  StrWriter::operator<<(str,(Dn)(uVar5 >> 0xc & 7));
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar9 = ';';
    lVar7 = 1;
    do {
      pcVar8 = *s;
      *s = pcVar8 + 1;
      *pcVar8 = cVar9;
      cVar9 = "trap%-2s  ; (2+)"[lVar7 + 10];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmBitFieldDn(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word>(addr);
    auto dst = _____________xxx(op);
    auto o   = _____xxxxx______(ext);
    auto w   = ___________xxxxx(ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << str.tab;

    if constexpr (I == Instr::BFINS) {
        str << Dn ( _xxx____________(ext) ) << Sep{};
    }

    str << Op<M, S>(dst, addr);

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            switch (ext & 0x0820) {

                case 0x0000: str << "," << o << "," << w; break;
                case 0x0020: str << "," << o << "," << Dn{w&7}; break;
                case 0x0800: str << "," << Dn{o&7} << "," << w; break;
                case 0x0820: str << "," << Dn{o&7} << "," << Dn{w&7}; break;
            }
            break;

        default:

            if (w == 0) w = 32;

            switch (ext & 0x0820) {

                case 0x0000: str << " {" << o << ":" << w << "}"; break;
                case 0x0020: str << " {" << o << ":" << Dn{w&7} << "}"; break;
                case 0x0800: str << " {" << Dn{o&7} << ":" << w << "}"; break;
                case 0x0820: str << " {" << Dn{o&7} << ":" << Dn{w&7} << "}"; break;
            }
    }

    if constexpr (I == Instr::BFEXTU || I == Instr::BFEXTS || I == Instr::BFFFO) {
        str << Sep{} << Dn ( _xxx____________(ext) );
    }
    str << Av<I, M, S>{};
}